

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

void __thiscall moira::Moira::prefetch<(moira::Core)1,4ull>(Moira *this)

{
  u32 uVar1;
  Moira *this_local;
  
  (this->reg).pc0 = (this->reg).pc;
  (this->queue).ird = (this->queue).irc;
  uVar1 = read<(moira::Core)1,(moira::AddrSpace)2,2,4ull>(this,(this->reg).pc + 2);
  (this->queue).irc = (u16)uVar1;
  this->readBuffer = (this->queue).irc;
  return;
}

Assistant:

void
Moira::prefetch()
{
    /* Whereas pc is a moving target (it moves forward while an instruction is
     * being processed, pc0 stays stable throughout the entire execution of
     * an instruction. It always points to the start address of the currently
     * executed instruction.
     */
    reg.pc0 = reg.pc;

    queue.ird = queue.irc;
    queue.irc = (u16)read<C, AddrSpace::PROG, Word, F>(reg.pc + 2);
    readBuffer = queue.irc;
}